

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockNamedValueHandlerRepository_installMultipleComparators_Test::
TEST_MockNamedValueHandlerRepository_installMultipleComparators_Test
          (TEST_MockNamedValueHandlerRepository_installMultipleComparators_Test *this)

{
  TEST_MockNamedValueHandlerRepository_installMultipleComparators_Test *this_local;
  
  memset(this,0,8);
  TEST_GROUP_CppUTestGroupMockNamedValueHandlerRepository::
  TEST_GROUP_CppUTestGroupMockNamedValueHandlerRepository
            (&this->super_TEST_GROUP_CppUTestGroupMockNamedValueHandlerRepository);
  (this->super_TEST_GROUP_CppUTestGroupMockNamedValueHandlerRepository).super_Utest._vptr_Utest =
       (_func_int **)
       &PTR__TEST_MockNamedValueHandlerRepository_installMultipleComparators_Test_00334818;
  return;
}

Assistant:

TEST(MockNamedValueHandlerRepository, installMultipleComparators)
{
    TypeForTestingExpectedFunctionCallComparator comparator1, comparator2, comparator3;
    MockNamedValueComparatorsAndCopiersRepository repository;
    repository.installComparator("type1", comparator1);
    repository.installComparator("type2", comparator2);
    repository.installComparator("type3", comparator3);
    POINTERS_EQUAL(&comparator3, repository.getComparatorForType("type3"));
    POINTERS_EQUAL(&comparator2, repository.getComparatorForType("type2"));
    POINTERS_EQUAL(&comparator1, repository.getComparatorForType("type1"));
}